

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void AdditionHelper<signed_char,unsigned_char,0>::
     AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (char *lhs,uchar *rhs,char *result)

{
  char cVar1;
  byte bVar2;
  char cVar3;
  undefined1 *in_RDX;
  byte *in_RSI;
  char *in_RDI;
  int32_t tmp;
  
  cVar1 = *in_RDI;
  bVar2 = *in_RSI;
  cVar3 = std::numeric_limits<signed_char>::max();
  if ((int)((int)cVar1 + (uint)bVar2) <= (int)cVar3) {
    *in_RDX = (char)((int)cVar1 + (uint)bVar2);
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

TestVector() : test_cases(nullptr), count(0), current(0) {}